

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_ActivateSession
               (UA_Server *server,UA_SecureChannel *channel,UA_Session *session,
               UA_ActivateSessionRequest *request,UA_ActivateSessionResponse *response)

{
  long lVar1;
  UA_String *pUVar2;
  UA_UsernamePasswordLogin *pUVar3;
  bool bVar4;
  UA_Boolean UVar5;
  UA_DateTime UVar6;
  uint local_158;
  uint local_150;
  uint local_14c;
  uint local_138;
  uint local_130;
  uint local_12c;
  uint local_118;
  uint local_110;
  uint local_10c;
  uint local_f0;
  uint local_e8;
  uint local_e4;
  uint local_c8;
  uint local_c0;
  uint local_bc;
  UA_String *pw;
  UA_String *user;
  size_t i;
  UA_Boolean match;
  UA_UserNameIdentityToken *token_1;
  UA_AnonymousIdentityToken *token;
  UA_String up;
  UA_String ap;
  UA_ActivateSessionResponse *response_local;
  UA_ActivateSessionRequest *request_local;
  UA_Session *session_local;
  UA_SecureChannel *channel_local;
  UA_Server *server_local;
  
  lVar1 = session->validTill;
  UVar6 = UA_DateTime_nowMonotonic();
  if (lVar1 < UVar6) {
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_c0 = 0;
    }
    else {
      if (session->channel->connection == (UA_Connection *)0x0) {
        local_bc = 0;
      }
      else {
        local_bc = session->channel->connection->sockfd;
      }
      local_c0 = local_bc;
    }
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_c8 = 0;
    }
    else {
      local_c8 = (session->channel->securityToken).channelId;
    }
    UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: SecureChannel %i wants to activate, but the session has timed out"
                ,(ulong)local_c0,(ulong)local_c8,(ulong)(session->sessionId).identifier.numeric,
                (uint)(session->sessionId).identifier.guid.data2,
                (uint)(session->sessionId).identifier.guid.data3,
                (uint)(session->sessionId).identifier.guid.data4[0],
                (uint)(session->sessionId).identifier.guid.data4[1],
                (uint)(session->sessionId).identifier.guid.data4[2],
                (uint)(session->sessionId).identifier.guid.data4[3],
                (uint)(session->sessionId).identifier.guid.data4[4],
                (uint)(session->sessionId).identifier.guid.data4[5],
                (uint)(session->sessionId).identifier.guid.data4[6],
                (uint)(session->sessionId).identifier.guid.data4[7],
                (channel->securityToken).channelId);
    (response->responseHeader).serviceResult = 0x80250000;
  }
  else if (((request->userIdentityToken).encoding < UA_EXTENSIONOBJECT_DECODED) ||
          (((request->userIdentityToken).content.decoded.type != (UA_DataType *)0x160bf0 &&
           ((request->userIdentityToken).content.decoded.type != (UA_DataType *)0x161280)))) {
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_e8 = 0;
    }
    else {
      if (session->channel->connection == (UA_Connection *)0x0) {
        local_e4 = 0;
      }
      else {
        local_e4 = session->channel->connection->sockfd;
      }
      local_e8 = local_e4;
    }
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_f0 = 0;
    }
    else {
      local_f0 = (session->channel->securityToken).channelId;
    }
    UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: SecureChannel %i wants to activate, but the UserIdentify token is invalid"
                ,(ulong)local_e8,(ulong)local_f0,(ulong)(session->sessionId).identifier.numeric,
                (uint)(session->sessionId).identifier.guid.data2,
                (uint)(session->sessionId).identifier.guid.data3,
                (uint)(session->sessionId).identifier.guid.data4[0],
                (uint)(session->sessionId).identifier.guid.data4[1],
                (uint)(session->sessionId).identifier.guid.data4[2],
                (uint)(session->sessionId).identifier.guid.data4[3],
                (uint)(session->sessionId).identifier.guid.data4[4],
                (uint)(session->sessionId).identifier.guid.data4[5],
                (uint)(session->sessionId).identifier.guid.data4[6],
                (uint)(session->sessionId).identifier.guid.data4[7],
                (channel->securityToken).channelId);
    (response->responseHeader).serviceResult = 0x80200000;
  }
  else {
    join_0x00000010_0x00000000_ = UA_STRING("open62541-anonymous-policy");
    _token = UA_STRING("open62541-username-policy");
    if ((((server->config).enableAnonymousLogin & 1U) == 0) ||
       ((request->userIdentityToken).content.decoded.type != (UA_DataType *)0x160bf0)) {
      if ((((server->config).enableUsernamePasswordLogin & 1U) == 0) ||
         ((request->userIdentityToken).content.decoded.type != (UA_DataType *)0x161280)) {
        (response->responseHeader).serviceResult = 0x80200000;
        return;
      }
      pUVar2 = (UA_String *)(request->userIdentityToken).content.decoded.data;
      UVar5 = UA_String_equal(pUVar2,(UA_String *)&token);
      if (!UVar5) {
        (response->responseHeader).serviceResult = 0x80200000;
        return;
      }
      if (pUVar2[3].length != 0) {
        (response->responseHeader).serviceResult = 0x80200000;
        return;
      }
      if ((pUVar2[1].length == 0) && (pUVar2[2].length == 0)) {
        (response->responseHeader).serviceResult = 0x80200000;
        return;
      }
      bVar4 = false;
      for (user = (UA_String *)0x0; user < (UA_String *)(server->config).usernamePasswordLoginsSize;
          user = (UA_String *)((long)&user->length + 1)) {
        pUVar3 = (server->config).usernamePasswordLogins;
        UVar5 = UA_String_equal(pUVar2 + 1,
                                &(server->config).usernamePasswordLogins[(long)user].username);
        if ((UVar5) && (UVar5 = UA_String_equal(pUVar2 + 2,&pUVar3[(long)user].password), UVar5)) {
          bVar4 = true;
          break;
        }
      }
      if (!bVar4) {
        if (session->channel == (UA_SecureChannel *)0x0) {
          local_110 = 0;
        }
        else {
          if (session->channel->connection == (UA_Connection *)0x0) {
            local_10c = 0;
          }
          else {
            local_10c = session->channel->connection->sockfd;
          }
          local_110 = local_10c;
        }
        if (session->channel == (UA_SecureChannel *)0x0) {
          local_118 = 0;
        }
        else {
          local_118 = (session->channel->securityToken).channelId;
        }
        UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: Did not find matching username/password"
                    ,(ulong)local_110,(ulong)local_118,
                    (ulong)(session->sessionId).identifier.numeric,
                    (uint)(session->sessionId).identifier.guid.data2,
                    (uint)(session->sessionId).identifier.guid.data3,
                    (uint)(session->sessionId).identifier.guid.data4[0],
                    (uint)(session->sessionId).identifier.guid.data4[1],
                    (uint)(session->sessionId).identifier.guid.data4[2],
                    (uint)(session->sessionId).identifier.guid.data4[3],
                    (uint)(session->sessionId).identifier.guid.data4[4],
                    (uint)(session->sessionId).identifier.guid.data4[5],
                    (uint)(session->sessionId).identifier.guid.data4[6],
                    (uint)(session->sessionId).identifier.guid.data4[7]);
        (response->responseHeader).serviceResult = 0x801f0000;
        return;
      }
    }
    else {
      pUVar2 = (UA_String *)(request->userIdentityToken).content.decoded.data;
      if ((pUVar2->data != (UA_Byte *)0x0) &&
         (UVar5 = UA_String_equal(pUVar2,(UA_String *)&up.data), !UVar5)) {
        (response->responseHeader).serviceResult = 0x80200000;
        return;
      }
    }
    if ((session->channel != (UA_SecureChannel *)0x0) && (session->channel != channel)) {
      if (session->channel == (UA_SecureChannel *)0x0) {
        local_130 = 0;
      }
      else {
        if (session->channel->connection == (UA_Connection *)0x0) {
          local_12c = 0;
        }
        else {
          local_12c = session->channel->connection->sockfd;
        }
        local_130 = local_12c;
      }
      if (session->channel == (UA_SecureChannel *)0x0) {
        local_138 = 0;
      }
      else {
        local_138 = (session->channel->securityToken).channelId;
      }
      UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                  "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: Detach from old channel"
                  ,(ulong)local_130,(ulong)local_138,(ulong)(session->sessionId).identifier.numeric,
                  (uint)(session->sessionId).identifier.guid.data2,
                  (uint)(session->sessionId).identifier.guid.data3,
                  (uint)(session->sessionId).identifier.guid.data4[0],
                  (uint)(session->sessionId).identifier.guid.data4[1],
                  (uint)(session->sessionId).identifier.guid.data4[2],
                  (uint)(session->sessionId).identifier.guid.data4[3],
                  (uint)(session->sessionId).identifier.guid.data4[4],
                  (uint)(session->sessionId).identifier.guid.data4[5],
                  (uint)(session->sessionId).identifier.guid.data4[6],
                  (uint)(session->sessionId).identifier.guid.data4[7]);
      UA_SecureChannel_detachSession(session->channel,session);
    }
    UA_SecureChannel_attachSession(channel,session);
    session->activated = true;
    UA_Session_updateLifetime(session);
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_150 = 0;
    }
    else {
      if (session->channel->connection == (UA_Connection *)0x0) {
        local_14c = 0;
      }
      else {
        local_14c = session->channel->connection->sockfd;
      }
      local_150 = local_14c;
    }
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_158 = 0;
    }
    else {
      local_158 = (session->channel->securityToken).channelId;
    }
    UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: Session activated"
                ,(ulong)local_150,(ulong)local_158,(ulong)(session->sessionId).identifier.numeric,
                (uint)(session->sessionId).identifier.guid.data2,
                (uint)(session->sessionId).identifier.guid.data3,
                (uint)(session->sessionId).identifier.guid.data4[0],
                (uint)(session->sessionId).identifier.guid.data4[1],
                (uint)(session->sessionId).identifier.guid.data4[2],
                (uint)(session->sessionId).identifier.guid.data4[3],
                (uint)(session->sessionId).identifier.guid.data4[4],
                (uint)(session->sessionId).identifier.guid.data4[5],
                (uint)(session->sessionId).identifier.guid.data4[6],
                (uint)(session->sessionId).identifier.guid.data4[7]);
  }
  return;
}

Assistant:

void
Service_ActivateSession(UA_Server *server, UA_SecureChannel *channel,
                        UA_Session *session, const UA_ActivateSessionRequest *request,
                        UA_ActivateSessionResponse *response) {
    if(session->validTill < UA_DateTime_nowMonotonic()) {
        UA_LOG_INFO_SESSION(server->config.logger, session, "ActivateSession: SecureChannel %i wants "
                            "to activate, but the session has timed out", channel->securityToken.channelId);
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSESSIONIDINVALID;
        return;
    }

    if(request->userIdentityToken.encoding < UA_EXTENSIONOBJECT_DECODED ||
       (request->userIdentityToken.content.decoded.type != &UA_TYPES[UA_TYPES_ANONYMOUSIDENTITYTOKEN] &&
        request->userIdentityToken.content.decoded.type != &UA_TYPES[UA_TYPES_USERNAMEIDENTITYTOKEN])) {
        UA_LOG_INFO_SESSION(server->config.logger, session, "ActivateSession: SecureChannel %i wants "
                            "to activate, but the UserIdentify token is invalid", channel->securityToken.channelId);
        response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
        return;
    }


    UA_String ap = UA_STRING(ANONYMOUS_POLICY);
    UA_String up = UA_STRING(USERNAME_POLICY);

    /* Compatibility notice: Siemens OPC Scout v10 provides an empty policyId,
       this is not okay For compatibility we will assume that empty policyId == ANONYMOUS_POLICY
       if(token.policyId->data == NULL)
           response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
    */

    if(server->config.enableAnonymousLogin &&
       request->userIdentityToken.content.decoded.type == &UA_TYPES[UA_TYPES_ANONYMOUSIDENTITYTOKEN]) {
        /* anonymous login */
        const UA_AnonymousIdentityToken *token = request->userIdentityToken.content.decoded.data;
        if(token->policyId.data && !UA_String_equal(&token->policyId, &ap)) {
            response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
            return;
        }
    } else if(server->config.enableUsernamePasswordLogin &&
              request->userIdentityToken.content.decoded.type == &UA_TYPES[UA_TYPES_USERNAMEIDENTITYTOKEN]) {
        /* username login */
        const UA_UserNameIdentityToken *token = request->userIdentityToken.content.decoded.data;
        if(!UA_String_equal(&token->policyId, &up)) {
            response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
            return;
        }
        if(token->encryptionAlgorithm.length > 0) {
            /* we don't support encryption */
            response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
            return;
        }

        if(token->userName.length == 0 && token->password.length == 0) {
            /* empty username and password */
            response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
            return;
        }

        /* trying to match pw/username */
        UA_Boolean match = false;
        for(size_t i = 0; i < server->config.usernamePasswordLoginsSize; ++i) {
            UA_String *user = &server->config.usernamePasswordLogins[i].username;
            UA_String *pw = &server->config.usernamePasswordLogins[i].password;
            if(UA_String_equal(&token->userName, user) && UA_String_equal(&token->password, pw)) {
                match = true;
                break;
            }
        }
        if(!match) {
            UA_LOG_INFO_SESSION(server->config.logger, session,
                                "ActivateSession: Did not find matching username/password");
            response->responseHeader.serviceResult = UA_STATUSCODE_BADUSERACCESSDENIED;
            return;
        }
    } else {
        /* Unsupported token type */
        response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
        return;
    }

    /* Detach the old SecureChannel */
    if(session->channel && session->channel != channel) {
        UA_LOG_INFO_SESSION(server->config.logger, session, "ActivateSession: Detach from old channel");
        UA_SecureChannel_detachSession(session->channel, session);
    }

    /* Attach to the SecureChannel and activate */
    UA_SecureChannel_attachSession(channel, session);
    session->activated = true;
    UA_Session_updateLifetime(session);
    UA_LOG_INFO_SESSION(server->config.logger, session, "ActivateSession: Session activated");
}